

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::ByteSizeLong
          (BiDirectionalLSTMLayerParams *this)

{
  uint uVar1;
  LSTMParams *pLVar2;
  int iVar3;
  uint uVar4;
  Type *pTVar5;
  size_t sVar6;
  Type *this_00;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  uVar10 = (ulong)uVar1;
  if (uVar10 == 0) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,uVar9);
      sVar6 = ActivationParams::ByteSizeLong(pTVar5);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar10 = uVar10 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  uVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = uVar10 + uVar1;
  if ((ulong)uVar1 != 0) {
    uVar9 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,uVar9);
      sVar6 = ActivationParams::ByteSizeLong(pTVar5);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  uVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = lVar11 + (ulong)uVar1 * 2;
  if ((ulong)uVar1 != 0) {
    uVar9 = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                          (&(this->weightparams_).super_RepeatedPtrFieldBase,uVar9);
      sVar7 = LSTMWeightParams::ByteSizeLong(this_00);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  pLVar2 = this->params_;
  if (this != (BiDirectionalLSTMLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_ &&
      pLVar2 != (LSTMParams *)0x0) {
    lVar11 = 0;
    if (pLVar2->cellclipthreshold_ != 0.0) {
      lVar11 = 6;
    }
    if (NAN(pLVar2->cellclipthreshold_)) {
      lVar11 = 6;
    }
    lVar8 = lVar11 + 2;
    if (pLVar2->sequenceoutput_ == false) {
      lVar8 = lVar11;
    }
    lVar11 = lVar8 + 3;
    if (pLVar2->hasbiasvectors_ == false) {
      lVar11 = lVar8;
    }
    lVar8 = lVar11 + 3;
    if (pLVar2->forgetbias_ == false) {
      lVar8 = lVar11;
    }
    lVar11 = lVar8 + 3;
    if (pLVar2->haspeepholevectors_ == false) {
      lVar11 = lVar8;
    }
    lVar8 = lVar11 + 3;
    if (pLVar2->coupledinputandforgetgate_ == false) {
      lVar8 = lVar11;
    }
    pLVar2->_cached_size_ = (int)lVar8;
    sVar6 = sVar6 + lVar8 + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar10 = this->inputvectorsize_ | 1;
    lVar11 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar11 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar10 = this->outputvectorsize_ | 1;
    lVar11 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar11 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t BiDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  {
    unsigned int count = this->activationsforwardlstm_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activationsforwardlstm(i));
    }
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  {
    unsigned int count = this->activationsbackwardlstm_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activationsbackwardlstm(i));
    }
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  {
    unsigned int count = this->weightparams_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weightparams(i));
    }
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->params_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}